

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O2

int __thiscall CVmRun::compute_quotient(CVmRun *this,vm_val_t *val1,vm_val_t *val2)

{
  uint uVar1;
  int iVar2;
  
  while( true ) {
    if (val1->typ != VM_INT) {
      if (val1->typ == VM_OBJ) {
        uVar1 = (val1->val).obj;
        iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ +
                            0x128))(G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff),val1,uVar1,
                                    val2);
        return iVar2;
      }
      return 0;
    }
    iVar2 = vm_val_t::is_numeric(val2);
    if (iVar2 == 0) break;
    vm_val_t::promote_int(val2,val1);
  }
  err_throw(0x7d4);
}

Assistant:

int CVmRun::compute_quotient(VMG_ vm_val_t *val1, vm_val_t *val2)
{
check_type:
    switch(val1->typ)
    {
    case VM_OBJ:
        /* use the object's virtual division method */
        return vm_objp(vmg_ val1->val.obj)->div_val(
            vmg_ val1, val1->val.obj, val2);
        break;

    case VM_INT:
        /* callers handle int/int inline; check for other numeric types */
        if (val2->is_numeric(vmg0_))
        {
            /* promote to integer, then restart with the promoted value */
            val2->promote_int(vmg_ val1);
            goto check_type;
        }
        else
        {
            err_throw(VMERR_NUM_VAL_REQD);
            AFTER_ERR_THROW(return FALSE;)
        }

    default:
        /* other types are invalid */
        return FALSE;
    }
}